

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O2

UBool uhash_compareChars_63(UHashTok key1,UHashTok key2)

{
  char cVar1;
  long lVar2;
  char *p2;
  char *p1;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    return '\0';
  }
  lVar2 = 0;
  while( true ) {
    cVar1 = *(char *)((long)key1.pointer + lVar2);
    if ((cVar1 == '\0') || (cVar1 != *(char *)((long)key2.pointer + lVar2))) break;
    lVar2 = lVar2 + 1;
  }
  return cVar1 == *(char *)((long)key2.pointer + lVar2);
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareChars(const UHashTok key1, const UHashTok key2) {
    const char *p1 = (const char*) key1.pointer;
    const char *p2 = (const char*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && *p1 == *p2) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}